

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O0

Self * __thiscall
draco::PointAttributeVectorOutputIterator<float>::operator=
          (PointAttributeVectorOutputIterator<float> *this,VectorD<float,_3> *val)

{
  bool bVar1;
  AttributeValueIndex AVar2;
  reference pvVar3;
  __tuple_element_t<0UL,_tuple<PointAttribute_*,_unsigned_int,_DataType,_unsigned_int,_unsigned_int>_>
  *ppPVar4;
  size_t sVar5;
  Self *in_RDI;
  uint32_t *offset;
  AttributeValueIndex avi;
  PointAttribute *attribute;
  AttributeTuple *att;
  PointAttribute *in_stack_ffffffffffffffa8;
  uint local_34;
  uint uVar6;
  __tuple_element_t<0UL,_tuple<PointAttribute_*,_unsigned_int,_DataType,_unsigned_int,_unsigned_int>_>
  this_00;
  AttributeValueIndex entry_index;
  Self *local_8;
  
  pvVar3 = std::
           vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
           ::operator[](&in_RDI->attributes_,0);
  entry_index.value_ = (uint)((ulong)pvVar3 >> 0x20);
  ppPVar4 = std::
            get<0ul,draco::PointAttribute*,unsigned_int,draco::DataType,unsigned_int,unsigned_int>
                      ((tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                        *)0x205c14);
  this_00 = *ppPVar4;
  uVar6 = (in_RDI->point_id_).value_;
  AVar2 = PointAttribute::mapped_index(in_stack_ffffffffffffffa8,(uint)in_RDI);
  sVar5 = PointAttribute::size(this_00);
  local_34 = (uint)sVar5;
  bVar1 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator>=
                    ((IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                     &stack0xffffffffffffffd4,&local_34);
  local_8 = in_RDI;
  if (!bVar1) {
    std::get<1ul,draco::PointAttribute*,unsigned_int,draco::DataType,unsigned_int,unsigned_int>
              ((tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                *)0x205c76);
    VectorD<float,_3>::operator[]((VectorD<float,_3> *)in_RDI,(int)((ulong)this_00 >> 0x20));
    GeometryAttribute::SetAttributeValue
              (&this_00->super_GeometryAttribute,entry_index,(void *)CONCAT44(AVar2.value_,uVar6));
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

const Self &operator=(const VectorD<CoeffT, 3> &val) {
    DRACO_DCHECK_EQ(attributes_.size(), 1);  // Expect only ONE attribute.
    AttributeTuple &att = attributes_[0];
    PointAttribute *attribute = std::get<0>(att);
    const AttributeValueIndex avi = attribute->mapped_index(point_id_);
    if (avi >= static_cast<uint32_t>(attribute->size())) {
      return *this;
    }
    const uint32_t &offset = std::get<1>(att);
    DRACO_DCHECK_EQ(offset, 0);  // expected to be zero
    attribute->SetAttributeValue(avi, &val[0] + offset);
    return *this;
  }